

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createTrianglePlane
          (SceneGraph *this,Vec3fa *p0,Vec3fa *dx,Vec3fa *dy,size_t width,size_t height,
          Ref<embree::SceneGraph::MaterialNode> material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  TriangleMeshNode *this_00;
  Vec3fa *pVVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  int iVar20;
  ulong uVar21;
  size_t sVar22;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *this_01;
  bool bVar23;
  float fVar24;
  float fVar25;
  Ref<embree::SceneGraph::MaterialNode> local_60;
  ulong local_58;
  Node *local_50;
  ulong local_48;
  Vec3fa *local_40;
  Vec3fa *local_38;
  
  local_50 = (Node *)this;
  local_38 = dy;
  this_00 = (TriangleMeshNode *)::operator_new(0xd8);
  local_60.ptr = (MaterialNode *)((material.ptr)->super_Node).super_RefCount._vptr_RefCount;
  if (local_60.ptr != (MaterialNode *)0x0) {
    (*((local_60.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  TriangleMeshNode::TriangleMeshNode(this_00,&local_60,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_60.ptr != (MaterialNode *)0x0) {
    (*((local_60.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pvVar3 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = height + 1;
  uVar17 = local_58 * (width + 1);
  uVar15 = pvVar3->size_alloced;
  uVar18 = uVar15;
  if ((uVar15 < uVar17) && (uVar21 = uVar15, uVar18 = uVar17, uVar15 != 0)) {
    for (; uVar18 = uVar21, uVar21 < uVar17; uVar21 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0)) {
    }
  }
  if (uVar17 < pvVar3->size_active) {
    pvVar3->size_active = uVar17;
  }
  if (uVar15 == uVar18) {
    pvVar3->size_active = uVar17;
  }
  else {
    local_40 = pvVar3->items;
    local_48 = uVar18;
    pVVar12 = (Vec3fa *)alignedMalloc(uVar18 << 4,0x10);
    pvVar3->items = pVVar12;
    lVar13 = 0;
    for (uVar15 = 0; uVar15 < pvVar3->size_active; uVar15 = uVar15 + 1) {
      puVar1 = (undefined8 *)((long)&local_40->field_0 + lVar13);
      uVar11 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar13);
      *puVar2 = *puVar1;
      puVar2[1] = uVar11;
      lVar13 = lVar13 + 0x10;
    }
    alignedFree(local_40);
    pvVar3->size_active = uVar17;
    pvVar3->size_alloced = local_48;
  }
  this_01 = &this_00->triangles;
  std::
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  ::resize(this_01,width * height * 2);
  lVar13 = 0;
  for (uVar15 = 0; uVar15 != local_58; uVar15 = uVar15 + 1) {
    fVar24 = (float)uVar15 / (float)height;
    lVar16 = lVar13;
    for (uVar18 = 0; width + 1 != uVar18; uVar18 = uVar18 + 1) {
      fVar25 = (float)uVar18 / (float)width;
      fVar5 = (dx->field_0).m128[1];
      fVar6 = (dx->field_0).m128[2];
      fVar7 = (p0->field_0).m128[1];
      fVar8 = (p0->field_0).m128[2];
      fVar9 = (local_38->field_0).m128[1];
      fVar10 = (local_38->field_0).m128[2];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar16) =
           (local_38->field_0).m128[0] * fVar24 +
           fVar25 * (dx->field_0).m128[0] + (p0->field_0).m128[0];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar16 + 4) =
           fVar9 * fVar24 + fVar25 * fVar5 + fVar7;
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar16 + 8) =
           fVar10 * fVar24 + fVar25 * fVar6 + fVar8;
      lVar16 = lVar16 + 0x10;
    }
    lVar13 = lVar13 + width * 0x10 + 0x10;
  }
  iVar4 = (int)width;
  iVar14 = 1;
  lVar13 = 0;
  sVar19 = 0;
  while (sVar19 != height) {
    sVar19 = sVar19 + 1;
    lVar16 = lVar13;
    sVar22 = width;
    iVar20 = iVar14;
    while (bVar23 = sVar22 != 0, sVar22 = sVar22 - 1, bVar23) {
      *(int *)((long)&((this_01->
                       super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                       )._M_impl.super__Vector_impl_data._M_start)->v0 + lVar16) = iVar20 + -1;
      *(int *)((long)&((this_01->
                       super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                       )._M_impl.super__Vector_impl_data._M_start)->v1 + lVar16) = iVar20;
      *(int *)((long)&((this_01->
                       super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                       )._M_impl.super__Vector_impl_data._M_start)->v2 + lVar16) = iVar4 + iVar20;
      *(int *)((long)&(this_01->
                      super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                      )._M_impl.super__Vector_impl_data._M_start[1].v0 + lVar16) =
           iVar4 + 1 + iVar20;
      *(int *)((long)&(this_01->
                      super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                      )._M_impl.super__Vector_impl_data._M_start[1].v1 + lVar16) = iVar4 + iVar20;
      *(int *)((long)&(this_01->
                      super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                      )._M_impl.super__Vector_impl_data._M_start[1].v2 + lVar16) = iVar20;
      lVar16 = lVar16 + 0x18;
      iVar20 = iVar20 + 1;
    }
    lVar13 = lVar13 + width * 0x18;
    iVar14 = iVar14 + iVar4 + 1;
  }
  (local_50->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_50;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createTrianglePlane (const Vec3fa& p0, const Vec3fa& dx, const Vec3fa& dy, size_t width, size_t height, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize((width+1)*(height+1));
    mesh->triangles.resize(2*width*height);

    for (size_t y=0; y<=height; y++) {
      for (size_t x=0; x<=width; x++) {
        Vec3fa p = p0+float(x)/float(width)*dx+float(y)/float(height)*dy;
        size_t i = y*(width+1)+x;
        mesh->positions[0][i].x = p.x;
        mesh->positions[0][i].y = p.y;
        mesh->positions[0][i].z = p.z;
      }
    }
    for (size_t y=0; y<height; y++) {
      for (size_t x=0; x<width; x++) {
        size_t i = 2*y*width+2*x;
        size_t p00 = (y+0)*(width+1)+(x+0);
        size_t p01 = (y+0)*(width+1)+(x+1);
        size_t p10 = (y+1)*(width+1)+(x+0);
        size_t p11 = (y+1)*(width+1)+(x+1);
        mesh->triangles[i+0].v0 = unsigned(p00); mesh->triangles[i+0].v1 = unsigned(p01); mesh->triangles[i+0].v2 = unsigned(p10);
        mesh->triangles[i+1].v0 = unsigned(p11); mesh->triangles[i+1].v1 = unsigned(p10); mesh->triangles[i+1].v2 = unsigned(p01);
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }